

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextbookBoyerMoore.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::TextbookBoyerMoore<char16_t>::Match<4u,1u>
          (TextbookBoyerMoore<char16_t> *this,Char *input,CharCount inputLength,
          CharCount *inputOffset,Char *pat,CharCount patLen,RegexStats *stats)

{
  Char CVar1;
  Char kc;
  int *piVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  int iVar6;
  undefined4 *puVar7;
  Type *this_00;
  int iVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  CharCount index;
  int iVar13;
  int local_38;
  uint local_34;
  int lastOcc;
  
  if (input == (Char *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/TextbookBoyerMoore.cpp"
                       ,0xb9,"(input != 0)","input != 0");
    if (!bVar4) goto LAB_00d59993;
    *puVar7 = 0;
  }
  if (inputLength < *inputOffset) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/TextbookBoyerMoore.cpp"
                       ,0xba,"(inputOffset <= inputLength)","inputOffset <= inputLength");
    if (!bVar4) {
LAB_00d59993:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  if (patLen <= inputLength) {
    uVar9 = *inputOffset;
    uVar10 = patLen - 1;
    piVar2 = (this->goodSuffix).ptr;
    this_00 = &this->lastOccurrence;
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    local_34 = inputLength - uVar10;
    for (; uVar9 < local_34; uVar9 = iVar13 + uVar9) {
      while (CVar1 = input[uVar10 + uVar9], pat[patLen * 4 - 4] != CVar1) {
        uVar12 = (uint)(ushort)CVar1;
        if ((ushort)CVar1 < 0x100) {
          BVar5 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::IsInDirectMap
                            (this_00,uVar12);
          if (BVar5 == 0) {
            uVar9 = uVar9 + patLen;
            if (local_34 <= uVar9) {
              return false;
            }
          }
          else {
            local_38 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::GetDirectMap
                                 (this_00,uVar12);
LAB_00d59842:
            uVar12 = local_34;
            iVar8 = uVar10 - local_38;
            if (iVar8 < piVar2[uVar10]) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar7 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/TextbookBoyerMoore.cpp"
                                 ,0xeb,
                                 "((int)lastPatCharIndex - lastOcc >= localGoodSuffix[lastPatCharIndex])"
                                 ,
                                 "(int)lastPatCharIndex - lastOcc >= localGoodSuffix[lastPatCharIndex]"
                                );
              if (!bVar4) goto LAB_00d59993;
              *puVar7 = 0;
              iVar8 = uVar10 - local_38;
            }
            uVar9 = iVar8 + uVar9;
            if (uVar12 <= uVar9) {
              return false;
            }
          }
        }
        else {
          bVar4 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::GetNonDirect
                            (this_00,uVar12,&local_38);
          if (bVar4) goto LAB_00d59842;
          uVar9 = uVar9 + patLen;
          if (local_34 <= uVar9) {
            return false;
          }
        }
      }
      lVar11 = (ulong)(patLen - 2) << 0x20;
      index = patLen - 2;
      if ((ulong)uVar10 == 0) {
LAB_00d59989:
        *inputOffset = uVar9;
        return true;
      }
      while( true ) {
        if (stats != (RegexStats *)0x0) {
          stats->numCompares = stats->numCompares + 1;
        }
        kc = input[uVar9 + index];
        bVar4 = MatchPatternAt<4u,4u>((uint)(ushort)kc,pat,index);
        if (!bVar4) break;
        index = index - 1;
        lVar11 = lVar11 + -0x100000000;
        if ((int)index < 0) goto LAB_00d59989;
      }
      iVar6 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::Get(this_00,kc);
      iVar8 = *(int *)((long)piVar2 + (lVar11 >> 0x1e));
      iVar13 = index - iVar6;
      if ((int)(index - iVar6) <= iVar8) {
        iVar13 = iVar8;
      }
    }
  }
  return false;
}

Assistant:

bool TextbookBoyerMoore<C>::Match
        ( const Char *const input
        , const CharCount inputLength
        , CharCount& inputOffset
        , const Char* pat
        , const CharCount patLen
#if ENABLE_REGEX_CONFIG_OPTIONS
        , RegexStats* stats
#endif
        ) const
    {

        Assert(input != 0);
        Assert(inputOffset <= inputLength);

        if (inputLength < patLen)
            return false;

        CharCount offset = inputOffset;

        const CharCount endOffset = inputLength - (patLen - 1);
        const int32* const localGoodSuffix = goodSuffix;
        const LastOccMap* const localLastOccurrence = &lastOccurrence;

        const CharCount lastPatCharIndex = (patLen - 1);

        while (offset < endOffset)
        {
            // A separate tight loop to find the last character
            while (true)
            {
                uint inputChar = Chars<Char>::CTU(input[offset + lastPatCharIndex]);
                if (MatchPatternAt<equivClassSize, lastPatCharEquivClass>(inputChar, pat, lastPatCharIndex))
                {
                    // Found a match. Break out of this loop and go to the match pattern loop
                    break;
                }
                // Negative case is more common,
                // Write the checks so that we have a super tight loop
                int lastOcc;
                if (inputChar < localLastOccurrence->GetDirectMapSize())
                {
                    if (!localLastOccurrence->IsInDirectMap(inputChar))
                    {
                        offset += patLen;
                        if (offset >= endOffset)
                        {
                            return false;
                        }
                        continue;
                    }
                    lastOcc = localLastOccurrence->GetDirectMap(inputChar);
                }
                else if (!localLastOccurrence->GetNonDirect(inputChar, lastOcc))
                {
                    offset += patLen;
                    if (offset >= endOffset)
                    {
                        return false;
                    }
                    continue;
                }
                Assert((int)lastPatCharIndex - lastOcc >= localGoodSuffix[lastPatCharIndex]);
                offset += lastPatCharIndex - lastOcc;
                if (offset >= endOffset)
                {
                    return false;
                }
            }

            // CONSIDER: we can remove this check if we stop using TextbookBoyerMoore for one char pattern
            if (lastPatCharIndex == 0)
            {
                inputOffset = offset;
                return true;
            }

            // Match the rest of the pattern
            int32 j = lastPatCharIndex - 1;
            while (true)
            {
#if ENABLE_REGEX_CONFIG_OPTIONS
                if (stats != 0)
                    stats->numCompares++;
#endif
                uint inputChar = Chars<Char>::CTU(input[offset + j]);
                if (!MatchPatternAt<equivClassSize, equivClassSize>(inputChar, pat, j))
                {
                    const int32 e = j - localLastOccurrence->Get((Char)inputChar);
                    offset += e > localGoodSuffix[j] ? e : localGoodSuffix[j];
                    break;
                }
                if (--j < 0)
                {
                    inputOffset = offset;
                    return true;
                }
            }
        }
        return false;
    }